

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containersNative.cpp
# Opt level: O3

INativePtr * __thiscall
chatra::emb::containers::ContainersPackageInterface::restoreNativePtr
          (ContainersPackageInterface *this,PackageContext *pct,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream)

{
  int64_t iVar1;
  INativePtr *pIVar2;
  size_type __n;
  undefined8 *puVar3;
  pointer puVar4;
  size_t local_38;
  size_t offset;
  
  local_38 = 0;
  iVar1 = readRawInt(stream,&local_38);
  if ((int)iVar1 == 0) {
    pIVar2 = (INativePtr *)operator_new(0x30);
    *(undefined4 *)&pIVar2[1]._vptr_INativePtr = 0;
    *(undefined1 *)&pIVar2[2]._vptr_INativePtr = 0;
    pIVar2[3]._vptr_INativePtr = (_func_int **)0x0;
    pIVar2[4]._vptr_INativePtr = (_func_int **)0x0;
    pIVar2[5]._vptr_INativePtr = (_func_int **)0x0;
    pIVar2->_vptr_INativePtr = (_func_int **)&PTR__ByteArrayData_00247920;
    __n = readRawInt(stream,&local_38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pIVar2 + 3),__n);
    puVar4 = (stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + local_38;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)(pIVar2 + 3),
               pIVar2[4]._vptr_INativePtr,puVar4,puVar4 + __n);
    return pIVar2;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  *puVar3 = &PTR__NativeException_00242e10;
  puVar3[1] = puVar3 + 3;
  *(undefined1 *)(puVar3 + 3) = 0;
  __cxa_throw(puVar3,&NativeException::typeinfo,NativeException::~NativeException);
}

Assistant:

INativePtr* restoreNativePtr(PackageContext& pct, const std::vector<uint8_t>& stream) override {
		(void)pct;
		size_t offset = 0;

		auto type = readInt<Type>(stream, offset);
		switch (type) {
		case Type::ByteArray: {
			auto* self = new ByteArrayData();
			auto size = readInt<size_t>(stream, offset);
			self->data.reserve(size);
			self->data.insert(self->data.cend(), stream.cbegin() + offset, stream.cbegin() + offset + size);
			return self;
		}

		default:
			throw NativeException();
		}
	}